

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDockableDragDropTarget(ImGuiWindow *window)

{
  bool bVar1;
  ImGuiPayload *pIVar2;
  ImGuiDockNode *pIVar3;
  long in_RDI;
  float _y;
  ImGuiDockNode *root_node;
  ImGuiDockPreviewData *split_data;
  ImGuiDockPreviewData split_outer;
  ImGuiDockPreviewData split_inner;
  bool do_preview;
  bool is_explicit_target;
  ImRect explicit_target_rect;
  bool allow_null_target_node;
  ImGuiDockNode *node;
  ImGuiWindow *payload_window;
  ImGuiPayload *payload;
  ImGuiContext *g;
  ImGuiContext *ctx;
  ImVec2 *in_stack_fffffffffffffcf8;
  ImGuiID in_stack_fffffffffffffd04;
  ImRect *in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd11;
  undefined1 in_stack_fffffffffffffd12;
  bool bVar4;
  undefined1 in_stack_fffffffffffffd13;
  undefined4 in_stack_fffffffffffffd14;
  float _x;
  ImGuiWindow *in_stack_fffffffffffffd18;
  ImGuiDockPreviewData *in_stack_fffffffffffffd20;
  undefined1 *local_2d0;
  undefined1 in_stack_fffffffffffffd3f;
  float in_stack_fffffffffffffd40;
  ImGuiDir in_stack_fffffffffffffd44;
  ImVec2 in_stack_fffffffffffffd48;
  ImGuiDockNode *in_stack_fffffffffffffd50;
  ImGuiWindow *in_stack_fffffffffffffd58;
  ImGuiContext *in_stack_fffffffffffffd60;
  ImGuiDragDropFlags in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  ImGuiDockPreviewData *in_stack_fffffffffffffdb8;
  ImGuiWindow *in_stack_fffffffffffffdc0;
  ImGuiDockNode *in_stack_fffffffffffffdc8;
  ImGuiWindow *in_stack_fffffffffffffdd0;
  byte local_1fd;
  undefined1 local_198 [16];
  ImGuiDockPreviewData *in_stack_fffffffffffffe78;
  ImGuiWindow *in_stack_fffffffffffffe80;
  ImGuiDockNode *in_stack_fffffffffffffe88;
  ImGuiWindow *in_stack_fffffffffffffe90;
  ImVec2 local_70;
  ImVec2 local_68;
  ImRect local_60;
  ImVec2 local_50;
  byte local_41;
  ImGuiDockNode *local_40;
  undefined8 local_38;
  ImGuiPayload *local_30;
  ImRect local_28;
  ImGuiContext *local_18;
  ImGuiContext *local_10;
  long local_8;
  
  local_10 = GImGui;
  local_18 = GImGui;
  if ((GImGui->DragDropActive & 1U) != 0) {
    local_8 = in_RDI;
    local_28 = ImGuiWindow::Rect((ImGuiWindow *)0x1bc211);
    bVar1 = BeginDragDropTargetCustom(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_30 = &local_18->DragDropPayload;
      bVar1 = ImGuiPayload::IsDataType
                        ((ImGuiPayload *)
                         CONCAT44(in_stack_fffffffffffffd14,
                                  CONCAT13(in_stack_fffffffffffffd13,
                                           CONCAT12(in_stack_fffffffffffffd12,
                                                    CONCAT11(in_stack_fffffffffffffd11,
                                                             in_stack_fffffffffffffd10)))),
                         (char *)in_stack_fffffffffffffd08);
      if ((bVar1) &&
         (bVar1 = DockNodeIsDropAllowed
                            (in_stack_fffffffffffffd18,
                             (ImGuiWindow *)
                             CONCAT44(in_stack_fffffffffffffd14,
                                      CONCAT13(in_stack_fffffffffffffd13,
                                               CONCAT12(in_stack_fffffffffffffd12,
                                                        CONCAT11(in_stack_fffffffffffffd11,
                                                                 in_stack_fffffffffffffd10))))),
         bVar1)) {
        local_38 = *local_30->Data;
        pIVar2 = AcceptDragDropPayload(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
        if (pIVar2 != (ImGuiPayload *)0x0) {
          local_40 = (ImGuiDockNode *)0x0;
          local_41 = 0;
          if (*(long *)(local_8 + 0x418) == 0) {
            local_41 = *(long *)(local_8 + 0x410) == 0;
            if (!(bool)local_41) {
              local_40 = *(ImGuiDockNode **)(local_8 + 0x410);
            }
          }
          else {
            local_50 = (local_18->IO).MousePos;
            local_40 = DockNodeTreeFindNodeByPos
                                 ((ImGuiDockNode *)
                                  CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                  in_stack_fffffffffffffd48);
          }
          if ((((local_40 == (ImGuiDockNode *)0x0) || (local_40->TabBar == (ImGuiTabBar *)0x0)) ||
              (bVar1 = ImGuiDockNode::IsHiddenTabBar(local_40), bVar1)) ||
             (bVar1 = ImGuiDockNode::IsNoTabBar(local_40), bVar1)) {
            in_stack_fffffffffffffd20 = (ImGuiDockPreviewData *)(local_8 + 0x40);
            _x = *(float *)(local_8 + 0x48);
            _y = GetFrameHeight();
            ImVec2::ImVec2(&local_70,_x,_y);
            local_68 = ::operator+(in_stack_fffffffffffffcf8,(ImVec2 *)0x1bc41b);
            ImRect::ImRect(&local_60,(ImVec2 *)in_stack_fffffffffffffd20,&local_68);
          }
          else {
            local_60.Min = (local_40->TabBar->BarRect).Min;
            local_60.Max = (local_40->TabBar->BarRect).Max;
          }
          if (((local_18->IO).ConfigDockingWithShift & 1U) == 0) {
            IsMouseHoveringRect((ImVec2 *)in_stack_fffffffffffffd48,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                (bool)in_stack_fffffffffffffd3f);
          }
          bVar1 = ImGuiPayload::IsPreview(local_30);
          bVar4 = true;
          if (!bVar1) {
            bVar4 = ImGuiPayload::IsDelivery(local_30);
          }
          if ((bVar4 != false) && ((local_40 != (ImGuiDockNode *)0x0 || ((local_41 & 1) != 0)))) {
            ImGuiDockPreviewData::ImGuiDockPreviewData(in_stack_fffffffffffffd20);
            ImGuiDockPreviewData::ImGuiDockPreviewData(in_stack_fffffffffffffd20);
            local_2d0 = local_198;
            if ((local_40 != (ImGuiDockNode *)0x0) &&
               (((local_40->ParentNode != (ImGuiDockNode *)0x0 ||
                 (bVar1 = ImGuiDockNode::IsCentralNode(local_40), bVar1)) &&
                ((pIVar3 = DockNodeGetRootNode(local_40), pIVar3 != (ImGuiDockNode *)0x0 &&
                 (DockNodePreviewDockSetup
                            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                             in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                             (bool)in_stack_fffffffffffffdb7,(bool)in_stack_fffffffffffffdb6),
                 (local_1fd & 1) != 0)))))) {
              local_2d0 = &stack0xfffffffffffffd48;
            }
            DockNodePreviewDockSetup
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0
                       ,in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7,
                       (bool)in_stack_fffffffffffffdb6);
            DockNodePreviewDockRender
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
                       ,in_stack_fffffffffffffe78);
            DockNodePreviewDockRender
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
                       ,in_stack_fffffffffffffe78);
            if (((local_2d0[0xb8] & 1) != 0) && (bVar1 = ImGuiPayload::IsDelivery(local_30), bVar1))
            {
              DockContextQueueDock
                        (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                         in_stack_fffffffffffffd50,(ImGuiWindow *)in_stack_fffffffffffffd48,
                         in_stack_fffffffffffffd44,in_stack_fffffffffffffd40,
                         (bool)in_stack_fffffffffffffd3f);
            }
            ImGuiDockPreviewData::~ImGuiDockPreviewData((ImGuiDockPreviewData *)0x1bc701);
            ImGuiDockPreviewData::~ImGuiDockPreviewData((ImGuiDockPreviewData *)0x1bc70e);
          }
        }
        EndDragDropTarget();
      }
      else {
        EndDragDropTarget();
      }
    }
  }
  return;
}

Assistant:

void ImGui::BeginDockableDragDropTarget(ImGuiWindow* window)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    //IM_ASSERT(window->RootWindow == window); // May also be a DockSpace
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    if (!g.DragDropActive)
        return;
    if (!BeginDragDropTargetCustom(window->Rect(), window->ID))
        return;

    // Peek into the payload before calling AcceptDragDropPayload() so we can handle overlapping dock nodes with filtering
    // (this is a little unusual pattern, normally most code would call AcceptDragDropPayload directly)
    const ImGuiPayload* payload = &g.DragDropPayload;
    if (!payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) || !DockNodeIsDropAllowed(window, *(ImGuiWindow**)payload->Data))
    {
        EndDragDropTarget();
        return;
    }

    ImGuiWindow* payload_window = *(ImGuiWindow**)payload->Data;
    if (AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, ImGuiDragDropFlags_AcceptBeforeDelivery | ImGuiDragDropFlags_AcceptNoDrawDefaultRect))
    {
        // Select target node
        ImGuiDockNode* node = NULL;
        bool allow_null_target_node = false;
        if (window->DockNodeAsHost)
            node = DockNodeTreeFindNodeByPos(window->DockNodeAsHost, g.IO.MousePos);
        else if (window->DockNode) // && window->DockIsActive)
            node = window->DockNode;
        else
            allow_null_target_node = true; // Dock into a regular window

        const ImRect explicit_target_rect = (node && node->TabBar && !node->IsHiddenTabBar() && !node->IsNoTabBar()) ? node->TabBar->BarRect : ImRect(window->Pos, window->Pos + ImVec2(window->Size.x, GetFrameHeight()));
        const bool is_explicit_target = g.IO.ConfigDockingWithShift || IsMouseHoveringRect(explicit_target_rect.Min, explicit_target_rect.Max);

        // Preview docking request and find out split direction/ratio
        //const bool do_preview = true;     // Ignore testing for payload->IsPreview() which removes one frame of delay, but breaks overlapping drop targets within the same window.
        const bool do_preview = payload->IsPreview() || payload->IsDelivery();
        if (do_preview && (node != NULL || allow_null_target_node))
        {
            ImGuiDockPreviewData split_inner;
            ImGuiDockPreviewData split_outer;
            ImGuiDockPreviewData* split_data = &split_inner;
            if (node && (node->ParentNode || node->IsCentralNode()))
                if (ImGuiDockNode* root_node = DockNodeGetRootNode(node))
                {
                    DockNodePreviewDockSetup(window, root_node, payload_window, &split_outer, is_explicit_target, true);
                    if (split_outer.IsSplitDirExplicit)
                        split_data = &split_outer;
                }
            DockNodePreviewDockSetup(window, node, payload_window, &split_inner, is_explicit_target, false);
            if (split_data == &split_outer)
                split_inner.IsDropAllowed = false;

            // Draw inner then outer, so that previewed tab (in inner data) will be behind the outer drop boxes
            DockNodePreviewDockRender(window, node, payload_window, &split_inner);
            DockNodePreviewDockRender(window, node, payload_window, &split_outer);

            // Queue docking request
            if (split_data->IsDropAllowed && payload->IsDelivery())
                DockContextQueueDock(ctx, window, split_data->SplitNode, payload_window, split_data->SplitDir, split_data->SplitRatio, split_data == &split_outer);
        }
    }
    EndDragDropTarget();
}